

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O2

void wallet::CachedTxGetAmounts
               (CWallet *wallet,CWalletTx *wtx,
               list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_> *listReceived,
               list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_> *listSent,
               CAmount *nFee,isminefilter *filter,bool include_change)

{
  long lVar1;
  element_type *peVar2;
  pointer pCVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  bool bVar4;
  isminetype iVar5;
  CAmount CVar6;
  CAmount CVar7;
  CTxOut *txout;
  int iVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffeb8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  COutputEntry output;
  string local_a8;
  CTxDestination address;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *nFee = 0;
  std::__cxx11::list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>::clear
            (listReceived);
  std::__cxx11::list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>::clear(listSent);
  CVar6 = CachedTxGetDebit(wallet,wtx,filter);
  if (0 < CVar6) {
    CVar7 = CTransaction::GetValueOut
                      ((wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    *nFee = CVar6 - CVar7;
  }
  uVar9 = 0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock4,&wallet->cs_wallet,"wallet.cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/receive.cpp"
             ,0xd3,false);
  do {
    iVar8 = (int)uVar9;
    peVar2 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar3) / 0x28) <= uVar9) {
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock4.super_unique_lock);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    txout = pCVar3 + uVar9;
    iVar5 = CWallet::IsMine(wallet,txout);
    if (CVar6 < 1) {
      if ((*filter & iVar5) != ISMINE_NO) goto LAB_00408dfa;
    }
    else if ((include_change) || (bVar4 = ScriptIsChange(wallet,&txout->scriptPubKey), !bVar4)) {
LAB_00408dfa:
      address.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_u._16_8_ = 0;
      address.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_u._24_8_ = 0;
      address.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_u._0_8_ = 0;
      address.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_u._8_8_ = 0;
      address.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_index = '\0';
      bVar4 = ExtractDestination(&txout->scriptPubKey,&address);
      if ((!bVar4) && (bVar4 = CScript::IsUnspendable(&txout->scriptPubKey), !bVar4)) {
        base_blob<256u>::ToString_abi_cxx11_
                  (&local_a8,
                   (base_blob<256u> *)
                   &((wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash);
        parameters._M_string_length = (size_type)wallet;
        parameters._M_dataplus._M_p = (pointer)in_stack_fffffffffffffeb8;
        parameters.field_2._M_allocated_capacity = (size_type)filter;
        parameters.field_2._8_8_ = wtx;
        CWallet::WalletLogPrintf<std::__cxx11::string>
                  (wallet,"CWalletTx::GetAmounts: Unknown transaction type found, txid %s\n",
                   parameters);
        std::__cxx11::string::~string((string *)&local_a8);
        output.destination.
        super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ._M_u._16_8_ = 0;
        output.destination.
        super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ._M_u._24_8_ = 0;
        output.destination.
        super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ._M_u._0_8_ = 0;
        output.destination.
        super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ._M_u._8_8_ = 0;
        std::
        variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
        ::operator=((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                     *)&address,(CNoDestination *)&output);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&output);
      }
      _GLOBAL__N_1::std::__detail::__variant::
      _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&output,
                        (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&address);
      output.amount = txout->nValue;
      output.vout = iVar8;
      if (0 < CVar6) {
        std::__cxx11::list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>::push_back
                  (listSent,&output);
      }
      if ((*filter & iVar5) != ISMINE_NO) {
        std::__cxx11::list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>::push_back
                  (listReceived,&output);
      }
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&output);
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&address);
    }
    uVar9 = (ulong)(iVar8 + 1);
  } while( true );
}

Assistant:

void CachedTxGetAmounts(const CWallet& wallet, const CWalletTx& wtx,
                  std::list<COutputEntry>& listReceived,
                  std::list<COutputEntry>& listSent, CAmount& nFee, const isminefilter& filter,
                  bool include_change)
{
    nFee = 0;
    listReceived.clear();
    listSent.clear();

    // Compute fee:
    CAmount nDebit = CachedTxGetDebit(wallet, wtx, filter);
    if (nDebit > 0) // debit>0 means we signed/sent this transaction
    {
        CAmount nValueOut = wtx.tx->GetValueOut();
        nFee = nDebit - nValueOut;
    }

    LOCK(wallet.cs_wallet);
    // Sent/received.
    for (unsigned int i = 0; i < wtx.tx->vout.size(); ++i)
    {
        const CTxOut& txout = wtx.tx->vout[i];
        isminetype fIsMine = wallet.IsMine(txout);
        // Only need to handle txouts if AT LEAST one of these is true:
        //   1) they debit from us (sent)
        //   2) the output is to us (received)
        if (nDebit > 0)
        {
            if (!include_change && OutputIsChange(wallet, txout))
                continue;
        }
        else if (!(fIsMine & filter))
            continue;

        // In either case, we need to get the destination address
        CTxDestination address;

        if (!ExtractDestination(txout.scriptPubKey, address) && !txout.scriptPubKey.IsUnspendable())
        {
            wallet.WalletLogPrintf("CWalletTx::GetAmounts: Unknown transaction type found, txid %s\n",
                                    wtx.GetHash().ToString());
            address = CNoDestination();
        }

        COutputEntry output = {address, txout.nValue, (int)i};

        // If we are debited by the transaction, add the output as a "sent" entry
        if (nDebit > 0)
            listSent.push_back(output);

        // If we are receiving the output, add it as a "received" entry
        if (fIsMine & filter)
            listReceived.push_back(output);
    }

}